

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_counter_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c0738::DebugCounterTest_DuplicateNamesWorkTogether_Test::
~DebugCounterTest_DuplicateNamesWorkTogether_Test
          (DebugCounterTest_DuplicateNamesWorkTogether_Test *this)

{
  DebugCounterTest_DuplicateNamesWorkTogether_Test *this_local;
  
  ~DebugCounterTest_DuplicateNamesWorkTogether_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DebugCounterTest, DuplicateNamesWorkTogether) {
  EXPECT_EXIT(
      {
        static google::protobuf::internal::RealDebugCounter counter("Foo.Baz");
        CounterOnATemplate<int>();
        CounterOnATemplate<int>();
        CounterOnATemplate<double>();
        counter.Inc();
        counter.Inc();
        exit(0);
      },
      ExitedWithCode(0),
      AllOf(HasSubstr("  Bar       :          3 (60.00%)"),
            HasSubstr("  Baz       :          2 (40.00%)"),
            HasSubstr("  Total     :          5")));
}